

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,double f)

{
  long lVar1;
  QStringView string;
  bool bVar2;
  RealNumberNotation RVar3;
  QFlagsStorage<QLocale::NumberOption> QVar4;
  QTextStreamPrivate *this_00;
  QTextStream *pQVar5;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  uint in_stack_0000001c;
  int in_stack_00000020;
  DoubleForm in_stack_00000024;
  QLocaleData *in_stack_00000028;
  QLocaleData *dd;
  uint flags;
  DoubleForm form;
  QTextStreamPrivate *d;
  QString num;
  NumberOptions numberOptions;
  int in_stack_000001ac;
  double in_stack_000001b0;
  undefined4 in_stack_fffffffffffffed8;
  NumberFlag in_stack_fffffffffffffedc;
  QTextStream *in_stack_fffffffffffffee0;
  QTextStream *in_stack_fffffffffffffee8;
  QString *str;
  QMessageLogger *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  byte bVar6;
  byte bVar7;
  undefined1 *puVar8;
  QString local_98;
  QFlagsStorageHelper<QLocale::NumberOption,_4> local_7c;
  QFlagsStorageHelper<QLocale::NumberOption,_4> local_78;
  QFlagsStorageHelper<QLocale::NumberOption,_4> local_74;
  undefined1 local_70 [16];
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_60;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_5c;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_58;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_54;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_50;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_4c;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_48;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_44;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_40;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_3c;
  undefined1 local_38 [12];
  Int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextStream *)0x4ac656);
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
               (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QMessageLogger::warning((QMessageLogger *)&stack0xffffffffffffffd8,"QTextStream: No device");
  }
  else {
    RVar3 = realNumberNotation(in_stack_fffffffffffffee0);
    local_2c = 0xaaaaaaaa;
    puVar8 = local_38;
    locale(in_stack_fffffffffffffee8);
    QVar4.i = (Int)QLocale::numberOptions((QLocale *)in_stack_fffffffffffffee0);
    local_2c = QVar4.i;
    QLocale::~QLocale((QLocale *)0x4ac751);
    local_40.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (QFlagsStorage<QTextStream::NumberFlag>)numberFlags(in_stack_fffffffffffffee0);
    local_3c.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (QFlagsStorage<QTextStream::NumberFlag>)
         QFlags<QTextStream::NumberFlag>::operator&
                   ((QFlags<QTextStream::NumberFlag> *)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc);
    ::QFlags::operator_cast_to_bool((QFlags *)&local_3c);
    local_48.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (QFlagsStorage<QTextStream::NumberFlag>)numberFlags(in_stack_fffffffffffffee0);
    local_44.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (QFlagsStorage<QTextStream::NumberFlag>)
         QFlags<QTextStream::NumberFlag>::operator&
                   ((QFlags<QTextStream::NumberFlag> *)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc);
    ::QFlags::operator_cast_to_bool((QFlags *)&local_44);
    local_50.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (QFlagsStorage<QTextStream::NumberFlag>)numberFlags(in_stack_fffffffffffffee0);
    local_4c.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (QFlagsStorage<QTextStream::NumberFlag>)
         QFlags<QTextStream::NumberFlag>::operator&
                   ((QFlags<QTextStream::NumberFlag> *)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc);
    ::QFlags::operator_cast_to_bool((QFlags *)&local_4c);
    local_58.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (QFlagsStorage<QTextStream::NumberFlag>)numberFlags(in_stack_fffffffffffffee0);
    local_54.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (QFlagsStorage<QTextStream::NumberFlag>)
         QFlags<QTextStream::NumberFlag>::operator&
                   ((QFlags<QTextStream::NumberFlag> *)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc);
    ::QFlags::operator_cast_to_bool((QFlags *)&local_54);
    local_60.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (QFlagsStorage<QTextStream::NumberFlag>)numberFlags(in_stack_fffffffffffffee0);
    local_5c.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (QFlagsStorage<QTextStream::NumberFlag>)
         QFlags<QTextStream::NumberFlag>::operator&
                   ((QFlags<QTextStream::NumberFlag> *)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc);
    ::QFlags::operator_cast_to_bool((QFlags *)&local_5c);
    pQVar5 = in_RDI;
    locale(in_stack_fffffffffffffee8);
    QLocale::c(local_70,pQVar5);
    bVar2 = ::operator!=((QLocale *)in_stack_fffffffffffffee0,
                         (QLocale *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    bVar6 = 0;
    if (bVar2) {
      local_74.super_QFlagsStorage<QLocale::NumberOption>.i =
           (QFlagsStorage<QLocale::NumberOption>)
           QFlags<QLocale::NumberOption>::operator&
                     ((QFlags<QLocale::NumberOption> *)in_stack_fffffffffffffee0,
                      in_stack_fffffffffffffedc);
      bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_74);
      bVar6 = bVar2 ^ 0xff;
    }
    bVar7 = bVar6;
    QLocale::~QLocale((QLocale *)0x4ac978);
    QLocale::~QLocale((QLocale *)0x4ac985);
    local_78.super_QFlagsStorage<QLocale::NumberOption>.i =
         (QFlagsStorage<QLocale::NumberOption>)
         QFlags<QLocale::NumberOption>::operator&
                   ((QFlags<QLocale::NumberOption> *)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc);
    ::QFlags::operator_cast_to_bool((QFlags *)&local_78);
    local_7c.super_QFlagsStorage<QLocale::NumberOption>.i =
         (QFlagsStorage<QLocale::NumberOption>)
         QFlags<QLocale::NumberOption>::operator&
                   ((QFlags<QLocale::NumberOption> *)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc);
    ::QFlags::operator_cast_to_bool((QFlags *)&local_7c);
    QSharedDataPointer<QLocalePrivate>::operator->
              ((QSharedDataPointer<QLocalePrivate> *)in_stack_fffffffffffffee0);
    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    str = &local_98;
    QLocaleData::doubleToString
              (in_stack_00000028,in_stack_000001b0,in_stack_000001ac,in_stack_00000024,
               in_stack_00000020,in_stack_0000001c);
    QStringView::QStringView<QString,_true>((QStringView *)this_00,str);
    string.m_data._0_4_ = QVar4.i;
    string.m_size = (qsizetype)puVar8;
    string.m_data._4_4_ = RVar3;
    QTextStreamPrivate::putString
              ((QTextStreamPrivate *)CONCAT17(bVar7,CONCAT16(bVar6,in_stack_fffffffffffffef8)),
               string,SUB81((ulong)this_00 >> 0x38,0));
    QString::~QString((QString *)0x4acaf7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QTextStream &QTextStream::operator<<(double f)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);

    QLocaleData::DoubleForm form = QLocaleData::DFDecimal;
    switch (realNumberNotation()) {
    case FixedNotation:
        form = QLocaleData::DFDecimal;
        break;
    case ScientificNotation:
        form = QLocaleData::DFExponent;
        break;
    case SmartNotation:
        form = QLocaleData::DFSignificantDigits;
        break;
    }

    uint flags = 0;
    const QLocale::NumberOptions numberOptions = locale().numberOptions();
    if (numberFlags() & ShowBase)
        flags |= QLocaleData::ShowBase;
    if (numberFlags() & ForceSign)
        flags |= QLocaleData::AlwaysShowSign;
    if (numberFlags() & UppercaseBase)
        flags |= QLocaleData::UppercaseBase;
    if (numberFlags() & UppercaseDigits)
        flags |= QLocaleData::CapitalEorX;
    if (numberFlags() & ForcePoint) {
        flags |= QLocaleData::ForcePoint;

        // Only for backwards compatibility
        flags |= QLocaleData::AddTrailingZeroes | QLocaleData::ShowBase;
    }
    if (locale() != QLocale::c() && !(numberOptions & QLocale::OmitGroupSeparator))
        flags |= QLocaleData::GroupDigits;
    if (!(numberOptions & QLocale::OmitLeadingZeroInExponent))
        flags |= QLocaleData::ZeroPadExponent;
    if (numberOptions & QLocale::IncludeTrailingZeroesAfterDot)
        flags |= QLocaleData::AddTrailingZeroes;

    const QLocaleData *dd = d->locale.d->m_data;
    QString num = dd->doubleToString(f, d->params.realNumberPrecision, form, -1, flags);
    d->putString(num, true);
    return *this;
}